

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::~ImageBindingRenderCase
          (ImageBindingRenderCase *this)

{
  ~ImageBindingRenderCase(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

ImageBindingRenderCase::~ImageBindingRenderCase (void)
{
	deinit();
}